

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_4::max_combined_block_number_limit
               (NegativeTestContext *ctx)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int maxCombinedSSBlocks;
  ProgramSources sources;
  MessageBuilder local_268;
  ProgramSources local_e8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"maxCombinedShaderStorageBlocks: Exceed limits",
             (allocator<char> *)&sources);
  NegativeTestContext::beginSection(ctx,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  memset(&sources,0,0xac);
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sources._193_8_ = 0;
  maxCombinedSSBlocks = 0;
  iVar3 = genMaxSSBlocksSource(ctx,0x8b31,&sources);
  iVar4 = genMaxSSBlocksSource(ctx,0x8b30,&sources);
  bVar2 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_TESSELLATION_CONTROL);
  iVar4 = iVar4 + iVar3;
  if (bVar2) {
    bVar2 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_TESSELLATION_EVALUATION);
    if (bVar2) {
      iVar3 = genMaxSSBlocksSource(ctx,0x8e88,&sources);
      iVar5 = genMaxSSBlocksSource(ctx,0x8e87,&sources);
      iVar4 = iVar3 + iVar4 + iVar5;
    }
  }
  bVar2 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_GEOMETRY);
  if (bVar2) {
    iVar3 = genMaxSSBlocksSource(ctx,0x8dd9,&sources);
    iVar4 = iVar4 + iVar3;
  }
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x90dc,&maxCombinedSSBlocks);
  local_268.m_log = (ctx->super_CallLogWrapper).m_log;
  poVar1 = &local_268.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS: ");
  std::ostream::operator<<(poVar1,maxCombinedSSBlocks);
  tcu::MessageBuilder::operator<<(&local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  local_268.m_log = (ctx->super_CallLogWrapper).m_log;
  poVar1 = &local_268.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Combined shader storage blocks: ");
  std::ostream::operator<<(poVar1,iVar4);
  tcu::MessageBuilder::operator<<(&local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (maxCombinedSSBlocks < iVar4) {
    glu::ProgramSources::ProgramSources(&local_e8,&sources);
    verifyProgram(ctx,&local_e8);
    glu::ProgramSources::~ProgramSources(&local_e8);
  }
  else {
    local_268.m_log = (ctx->super_CallLogWrapper).m_log;
    poVar1 = &local_268.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Test skipped: Combined shader storage blocks < GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS: "
                   );
    tcu::MessageBuilder::operator<<(&local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  NegativeTestContext::endSection(ctx);
  glu::ProgramSources::~ProgramSources(&sources);
  return;
}

Assistant:

void max_combined_block_number_limit (NegativeTestContext& ctx)
{
	ctx.beginSection("maxCombinedShaderStorageBlocks: Exceed limits");

	glu::ProgramSources sources;

	int combinedSSBlocks	= 0;
	int maxCombinedSSBlocks = 0;

	combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_VERTEX_SHADER, sources);
	combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_FRAGMENT_SHADER, sources);

	if ((ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_CONTROL)) && (ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_EVALUATION)))
	{
		combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_TESS_CONTROL_SHADER, sources);
		combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_TESS_EVALUATION_SHADER, sources);
	}

	if (ctx.isShaderSupported(glu::SHADERTYPE_GEOMETRY))
		combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_GEOMETRY_SHADER, sources);

	ctx.glGetIntegerv(GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS, &maxCombinedSSBlocks);

	ctx.getLog() << tcu::TestLog::Message << "GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS: " << maxCombinedSSBlocks << tcu::TestLog::EndMessage;
	ctx.getLog() << tcu::TestLog::Message << "Combined shader storage blocks: " << combinedSSBlocks << tcu::TestLog::EndMessage;

	if (combinedSSBlocks > maxCombinedSSBlocks)
		verifyProgram(ctx, sources);
	else
		ctx.getLog() << tcu::TestLog::Message << "Test skipped: Combined shader storage blocks < GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS: " << tcu::TestLog::EndMessage;

	ctx.endSection();
}